

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall soplex::SPxLPBase<double>::doRemoveCol(SPxLPBase<double> *this,int j)

{
  int iVar1;
  Item *pIVar2;
  uint uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  Item *pIVar6;
  
  pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[j].idx;
  uVar5 = (ulong)(uint)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
  lVar4 = uVar5 * 0x10 + -8;
  for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
    pIVar6 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
             [*(int *)((long)&(pIVar2[iVar1].data.super_SVectorBase<double>.m_elem)->val + lVar4)].
             idx;
    uVar3 = SVectorBase<double>::pos((SVectorBase<double> *)pIVar6,j);
    if (-1 < (int)uVar3) {
      SVectorBase<double>::remove((SVectorBase<double> *)pIVar6,(char *)(ulong)uVar3);
    }
    lVar4 = lVar4 + -0x10;
  }
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  i = iVar1 + -1;
  if (i != j) {
    pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
    iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[(long)iVar1 + -1].
            idx;
    uVar5 = (ulong)(uint)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
    lVar4 = uVar5 * 0x10 + -8;
    for (; 0 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
      pIVar6 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
               [*(int *)((long)&(pIVar2[iVar1].data.super_SVectorBase<double>.m_elem)->val + lVar4)]
               .idx;
      uVar3 = SVectorBase<double>::pos((SVectorBase<double> *)pIVar6,i);
      if (-1 < (int)uVar3) {
        (pIVar6->data).super_SVectorBase<double>.m_elem[uVar3].idx = j;
      }
      lVar4 = lVar4 + -0x10;
    }
  }
  LPColSetBase<double>::remove(&this->super_LPColSetBase<double>,(char *)(ulong)(uint)j);
  return;
}

Assistant:

virtual void doRemoveCol(int j)
   {

      const SVectorBase<R>& vec = colVector(j);
      int i;

      // remove column vector from row file
      for(i = vec.size() - 1; i >= 0; --i)
      {
         SVectorBase<R>& remvec = rowVector_w(vec.index(i));
         int position = remvec.pos(j);

         assert(position != -1);

         if(position >= 0)
            remvec.remove(position);
      }

      // move last column to removed position
      int idx = nCols() - 1;

      if(j != idx)
      {
         const SVectorBase<R>& l_vec = colVector(idx);

         for(i = l_vec.size() - 1; i >= 0; --i)
         {
            SVectorBase<R>& movevec = rowVector_w(l_vec.index(i));
            int position = movevec.pos(idx);

            assert(position != -1);

            if(position >= 0)
               movevec.index(position) = j;
         }
      }

      LPColSetBase<R>::remove(j);
   }